

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

void __thiscall QSocks5SocketEngine::~QSocks5SocketEngine(QSocks5SocketEngine *this)

{
  long lVar1;
  long *plVar2;
  void *pvVar3;
  
  *(undefined ***)this = &PTR_metaObject_002d0300;
  lVar1 = *(long *)(this + 8);
  plVar2 = *(long **)(lVar1 + 0xf8);
  if (plVar2 != (long *)0x0) {
    if ((long *)plVar2[1] != (long *)0x0) {
      (**(code **)(*(long *)plVar2[1] + 8))();
      plVar2 = *(long **)(lVar1 + 0xf8);
    }
    if ((long *)*plVar2 != (long *)0x0) {
      (**(code **)(*(long *)*plVar2 + 0x20))();
    }
  }
  pvVar3 = *(void **)(lVar1 + 0x100);
  if (pvVar3 != (void *)0x0) {
    QArrayDataPointer<QRingChunk>::~QArrayDataPointer
              ((QArrayDataPointer<QRingChunk> *)((long)pvVar3 + 0x10));
    operator_delete(pvVar3,0x38);
  }
  pvVar3 = *(void **)(lVar1 + 0x108);
  if (pvVar3 == (void *)0x0) goto LAB_00239a83;
  if (*(long **)((long)pvVar3 + 0x10) == (long *)0x0) {
LAB_00239a5f:
    QArrayDataPointer<QSocks5RevivedDatagram>::~QArrayDataPointer
              ((QArrayDataPointer<QSocks5RevivedDatagram> *)((long)pvVar3 + 0x28));
    QHostAddress::~QHostAddress((QHostAddress *)((long)pvVar3 + 0x18));
  }
  else {
    (**(code **)(**(long **)((long)pvVar3 + 0x10) + 0x20))();
    pvVar3 = *(void **)(lVar1 + 0x108);
    if (pvVar3 != (void *)0x0) goto LAB_00239a5f;
    pvVar3 = (void *)0x0;
  }
  operator_delete(pvVar3,0x40);
LAB_00239a83:
  pvVar3 = *(void **)(lVar1 + 0x110);
  if (pvVar3 != (void *)0x0) {
    QHostAddress::~QHostAddress((QHostAddress *)((long)pvVar3 + 0x20));
    QHostAddress::~QHostAddress((QHostAddress *)((long)pvVar3 + 0x10));
    operator_delete(pvVar3,0x40);
  }
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QSocks5SocketEngine::~QSocks5SocketEngine()
{
    Q_D(QSocks5SocketEngine);

    if (d->data) {
        delete d->data->authenticator;
        delete d->data->controlSocket;
    }
    if (d->connectData)
        delete d->connectData;
#ifndef QT_NO_UDPSOCKET
    if (d->udpData) {
        delete d->udpData->udpSocket;
        delete d->udpData;
    }
#endif
    if (d->bindData)
        delete d->bindData;
}